

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix33.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChMatrix33<double>::Get_A_Cardano
          (ChVector<double> *__return_storage_ptr__,ChMatrix33<double> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 local_38 [16];
  undefined1 extraout_var [56];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar1 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar1);
  auVar1 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar1);
  dVar7 = asin(auVar1._0_8_);
  __return_storage_ptr__->m_data[1] = dVar7;
  local_38._8_8_ = 0;
  local_38._0_8_ =
       (this->super_Matrix<double,_3,_3,_1,_3,_3>).
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  dVar8 = cos(dVar7);
  auVar1 = vunpcklpd_avx(*(undefined1 (*) [16])
                          ((this->super_Matrix<double,_3,_3,_1,_3,_3>).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 4),local_38);
  auVar9._0_8_ = cos(dVar7);
  auVar9._8_56_ = extraout_var;
  auVar6._8_8_ = extraout_XMM0_Qb;
  auVar6._0_8_ = dVar8;
  auVar2 = vunpcklpd_avx(auVar9._0_16_,auVar6);
  auVar1 = vdivpd_avx(auVar1,auVar2);
  auVar10._8_8_ = 0x3ff0000000000000;
  auVar10._0_8_ = 0x3ff0000000000000;
  auVar1 = vminpd_avx(auVar10,auVar1);
  auVar2._8_8_ = &DAT_bff0000000000000;
  auVar2._0_8_ = &DAT_bff0000000000000;
  uVar3 = vcmppd_avx512vl(auVar1,auVar2,1);
  auVar2 = vshufpd_avx(auVar1,auVar1,1);
  uVar5 = (uVar3 & 3) >> 1;
  bVar4 = (byte)(uVar3 & 3);
  dVar7 = acos((double)(uVar5 * -0x4010000000000000 + (ulong)!SUB81(uVar5,0) * auVar2._0_8_));
  __return_storage_ptr__->m_data[2] = dVar7;
  dVar7 = acos((double)((ulong)(bVar4 & 1) * -0x4010000000000000 +
                       (ulong)!(bool)(bVar4 & 1) * auVar1._0_8_));
  __return_storage_ptr__->m_data[0] = dVar7;
  return __return_storage_ptr__;
}

Assistant:

inline ChVector<Real> ChMatrix33<Real>::Get_A_Cardano() const {
    ChVector<Real> car;

    Real mel21 = (*this)(2, 1);
    if (mel21 > 1)
        mel21 = 1;
    if (mel21 < -1)
        mel21 = -1;

    car.y() = std::asin(mel21);

    Real arg2 = (*this)(2, 2) / std::cos(car.y());
    if (arg2 > 1)
        arg2 = 1;
    if (arg2 < -1)
        arg2 = -1;
    Real arg3 = (*this)(1, 1) / std::cos(car.y());
    if (arg3 > 1)
        arg3 = 1;
    if (arg3 < -1)
        arg3 = -1;

    car.z() = std::acos(arg2);
    car.x() = std::acos(arg3);

    return car;
}